

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void edition_unittest::TestFieldOrderings::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  HasBits<1> *pHVar1;
  uint uVar2;
  size_t sVar3;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  char *pcVar4;
  undefined8 *puVar5;
  void *pvVar6;
  Arena *arena;
  int line;
  Arena *arena_00;
  string_view value;
  TestFieldOrderings *_this;
  TestFieldOrderings *local_30;
  MessageLite *local_28 [2];
  
  arena_00 = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena_00 & 1) != 0) {
    arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
  }
  local_30 = (TestFieldOrderings *)to_msg;
  local_28[0] = from_msg;
  pcVar4 = absl::lts_20250127::log_internal::
           Check_NEImpl<edition_unittest::TestFieldOrderings_const*,edition_unittest::TestFieldOrderings*>
                     ((TestFieldOrderings **)local_28,&local_30,"&from != _this");
  if (pcVar4 != (Nullable<const_char_*>)0x0) {
    line = 0x6ca1;
LAB_009c268c:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/edition_unittest.pb.cc"
               ,line,pcVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28)
    ;
  }
  uVar2 = (uint)from_msg[2]._internal_metadata_.ptr_;
  if ((uVar2 & 0xf) != 0) {
    if ((uVar2 & 1) != 0) {
      puVar5 = (undefined8 *)((ulong)from_msg[3]._vptr_MessageLite & 0xfffffffffffffffc);
      pcVar4 = (char *)*puVar5;
      sVar3 = puVar5[1];
      pHVar1 = &(local_30->field_0)._impl_._has_bits_;
      pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | 1;
      arena = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
      }
      value._M_str = pcVar4;
      value._M_len = sVar3;
      google::protobuf::internal::ArenaStringPtr::Set
                (&(local_30->field_0)._impl_.my_string_,value,arena);
    }
    if ((uVar2 & 2) != 0) {
      from_msg_00 = (MessageLite *)from_msg[3]._internal_metadata_.ptr_;
      if (from_msg_00 == (MessageLite *)0x0) {
        pcVar4 = "from._impl_.optional_nested_message_ != nullptr";
        line = 0x6cab;
        goto LAB_009c268c;
      }
      to_msg_00 = *(MessageLite **)((long)&local_30->field_0 + 0x28);
      if (to_msg_00 == (MessageLite *)0x0) {
        pvVar6 = google::protobuf::Arena::
                 CopyConstruct<edition_unittest::TestFieldOrderings_NestedMessage>
                           (arena_00,from_msg_00);
        *(void **)((long)&local_30->field_0 + 0x28) = pvVar6;
      }
      else {
        TestFieldOrderings_NestedMessage::MergeImpl(to_msg_00,from_msg_00);
      }
    }
    if ((uVar2 & 4) != 0) {
      *(_func_int ***)((long)&local_30->field_0 + 0x30) = from_msg[4]._vptr_MessageLite;
    }
    if ((uVar2 & 8) != 0) {
      *(int *)((long)&local_30->field_0 + 0x38) = (int)from_msg[4]._internal_metadata_.ptr_;
    }
  }
  pHVar1 = &(local_30->field_0)._impl_._has_bits_;
  pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | uVar2;
  google::protobuf::internal::ExtensionSet::MergeFrom
            (&(local_30->field_0)._impl_._extensions_,
             (MessageLite *)_TestFieldOrderings_default_instance_,(ExtensionSet *)(from_msg + 1));
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_30->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void TestFieldOrderings::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestFieldOrderings*>(&to_msg);
  auto& from = static_cast<const TestFieldOrderings&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestFieldOrderings)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_my_string(from._internal_my_string());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.optional_nested_message_ != nullptr);
      if (_this->_impl_.optional_nested_message_ == nullptr) {
        _this->_impl_.optional_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_nested_message_);
      } else {
        _this->_impl_.optional_nested_message_->MergeFrom(*from._impl_.optional_nested_message_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.my_int_ = from._impl_.my_int_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.my_float_ = from._impl_.my_float_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}